

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O3

int iothubtransportamqp_methods_subscribe
              (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle,
              SESSION_HANDLE session_handle,ON_METHODS_ERROR on_methods_error,
              void *on_methods_error_context,ON_METHOD_REQUEST_RECEIVED on_method_request_received,
              void *on_method_request_received_context,
              ON_METHODS_UNSUBSCRIBED on_methods_unsubscribed,void *on_methods_unsubscribed_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE handle;
  char *pcVar3;
  AMQP_VALUE source;
  AMQP_VALUE target;
  STRING_HANDLE handle_00;
  LINK_HANDLE pLVar4;
  AMQP_VALUE source_00;
  AMQP_VALUE target_00;
  STRING_HANDLE handle_01;
  MESSAGE_RECEIVER_HANDLE pMVar5;
  MESSAGE_SENDER_HANDLE message_sender;
  int iVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(iothubtransport_amqp_methods_handle ==
                        (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)0x0);
  auVar7._4_4_ = -(uint)(session_handle == (SESSION_HANDLE)0x0);
  auVar7._8_4_ = -(uint)(on_methods_error == (ON_METHODS_ERROR)0x0);
  auVar7._12_4_ = -(uint)(on_method_request_received == (ON_METHOD_REQUEST_RECEIVED)0x0);
  iVar6 = movmskps((int)on_methods_error_context,auVar7);
  if (iVar6 != 0 || on_methods_unsubscribed == (ON_METHODS_UNSUBSCRIBED)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x25f;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
              ,"iothubtransportamqp_methods_subscribe",0x25e,1,
              "Invalid arguments: iothubtransport_amqp_methods_handle=%p, session_handle=%p, on_methods_error=%p, on_method_request_received=%p, on_methods_unsubscribed=%p"
              ,iothubtransport_amqp_methods_handle,session_handle,on_methods_error,
              on_method_request_received,on_methods_unsubscribed);
    return 0x25f;
  }
  if (iothubtransport_amqp_methods_handle->subscribe_state != SUBSCRIBE_STATE_NOT_SUBSCRIBED) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x264;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
              ,"iothubtransportamqp_methods_subscribe",0x263,1,"Already subscribed");
    return 0x264;
  }
  handle = create_peer_endpoint_name(iothubtransport_amqp_methods_handle);
  if (handle == (STRING_HANDLE)0x0) {
    return 0x26b;
  }
  iothubtransport_amqp_methods_handle->on_method_request_received = on_method_request_received;
  iothubtransport_amqp_methods_handle->on_method_request_received_context =
       on_method_request_received_context;
  iothubtransport_amqp_methods_handle->on_methods_error = on_methods_error;
  iothubtransport_amqp_methods_handle->on_methods_error_context = on_methods_error_context;
  iothubtransport_amqp_methods_handle->on_methods_unsubscribed = on_methods_unsubscribed;
  iothubtransport_amqp_methods_handle->on_methods_unsubscribed_context =
       on_methods_unsubscribed_context;
  pcVar3 = STRING_c_str(handle);
  source = messaging_create_source(pcVar3);
  if (source == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar6 = 0x27a;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"iothubtransportamqp_methods_subscribe",0x279,1,"Cannot create receiver source");
    }
    goto LAB_0013eee0;
  }
  target = messaging_create_target("requests");
  if (target == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar6 = 0x282;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"iothubtransportamqp_methods_subscribe",0x281,1,"Cannot create receiver target");
    }
  }
  else {
    handle_00 = create_requests_link_name(iothubtransport_amqp_methods_handle);
    if (handle_00 == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar6 = 0x28a;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                  ,"iothubtransportamqp_methods_subscribe",0x289,1,
                  "Cannot create methods requests link name.");
      }
    }
    else {
      pcVar3 = STRING_c_str(handle_00);
      pLVar4 = link_create(session_handle,pcVar3,true,source,target);
      iothubtransport_amqp_methods_handle->receiver_link = pLVar4;
      if (pLVar4 == (LINK_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        iVar6 = 0x292;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar3 = "Cannot create receiver link";
          iVar1 = 0x291;
LAB_0013ede4:
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                    ,"iothubtransportamqp_methods_subscribe",iVar1,1,pcVar3);
        }
      }
      else {
        source_00 = messaging_create_source("responses");
        if (source_00 == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          iVar6 = 0x29a;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            pcVar3 = "Cannot create sender source";
            iVar1 = 0x299;
            goto LAB_0013ede4;
          }
        }
        else {
          pcVar3 = STRING_c_str(handle);
          target_00 = messaging_create_target(pcVar3);
          if (target_00 == (AMQP_VALUE)0x0) {
            p_Var2 = xlogging_get_log_function();
            iVar6 = 0x2a2;
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                        ,"iothubtransportamqp_methods_subscribe",0x2a1,1,
                        "Cannot create sender target");
            }
          }
          else {
            handle_01 = create_responses_link_name(iothubtransport_amqp_methods_handle);
            if (handle_01 == (STRING_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              iVar6 = 0x2aa;
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                          ,"iothubtransportamqp_methods_subscribe",0x2a9,1,
                          "Cannot create methods responses link name.");
              }
            }
            else {
              pcVar3 = STRING_c_str(handle_01);
              pLVar4 = link_create(session_handle,pcVar3,false,source_00,target_00);
              iothubtransport_amqp_methods_handle->sender_link = pLVar4;
              if (pLVar4 == (LINK_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                iVar6 = 0x2b2;
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  pcVar3 = "Cannot create sender link";
                  iVar1 = 0x2b1;
                  goto LAB_0013ee9f;
                }
              }
              else {
                iVar1 = set_link_attach_properties(iothubtransport_amqp_methods_handle);
                iVar6 = 0x2b8;
                if (iVar1 == 0) {
                  pMVar5 = messagereceiver_create
                                     (iothubtransport_amqp_methods_handle->receiver_link,
                                      on_message_receiver_state_changed,
                                      iothubtransport_amqp_methods_handle);
                  iothubtransport_amqp_methods_handle->message_receiver = pMVar5;
                  if (pMVar5 == (MESSAGE_RECEIVER_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    iVar6 = 0x2c0;
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      pcVar3 = "Cannot create message receiver";
                      iVar1 = 0x2bf;
LAB_0013ee9f:
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                                ,"iothubtransportamqp_methods_subscribe",iVar1,1,pcVar3);
                    }
                  }
                  else {
                    message_sender =
                         messagesender_create
                                   (iothubtransport_amqp_methods_handle->sender_link,
                                    on_message_sender_state_changed,
                                    iothubtransport_amqp_methods_handle);
                    iothubtransport_amqp_methods_handle->message_sender = message_sender;
                    if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
                      p_Var2 = xlogging_get_log_function();
                      iVar6 = 0x2c8;
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        pcVar3 = "Cannot create message sender";
                        iVar1 = 0x2c7;
                        goto LAB_0013ee9f;
                      }
                    }
                    else {
                      iVar6 = messagesender_open(message_sender);
                      if (iVar6 == 0) {
                        iVar6 = messagereceiver_open
                                          (iothubtransport_amqp_methods_handle->message_receiver,
                                           on_message_received,iothubtransport_amqp_methods_handle);
                        if (iVar6 == 0) {
                          iothubtransport_amqp_methods_handle->subscribe_state =
                               SUBSCRIBE_STATE_SUBSCRIBED;
                          iVar6 = 0;
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          iVar6 = 0x2d6;
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            pcVar3 = "Cannot open the message receiver";
                            iVar1 = 0x2d5;
                            goto LAB_0013ee9f;
                          }
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        iVar6 = 0x2cf;
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          pcVar3 = "Cannot open the message sender";
                          iVar1 = 0x2ce;
                          goto LAB_0013ee9f;
                        }
                      }
                    }
                  }
                }
              }
              STRING_delete(handle_01);
            }
            amqpvalue_destroy(target_00);
          }
          amqpvalue_destroy(source_00);
        }
      }
      STRING_delete(handle_00);
    }
    amqpvalue_destroy(target);
  }
  amqpvalue_destroy(source);
LAB_0013eee0:
  STRING_delete(handle);
  return iVar6;
}

Assistant:

int iothubtransportamqp_methods_subscribe(IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle,
    SESSION_HANDLE session_handle, ON_METHODS_ERROR on_methods_error, void* on_methods_error_context,
    ON_METHOD_REQUEST_RECEIVED on_method_request_received, void* on_method_request_received_context,
    ON_METHODS_UNSUBSCRIBED on_methods_unsubscribed, void* on_methods_unsubscribed_context)
{
    int result;

    if ((iothubtransport_amqp_methods_handle == NULL) ||
        (session_handle == NULL) ||
        (on_methods_error == NULL) ||
        (on_method_request_received == NULL) ||
        (on_methods_unsubscribed == NULL))
    {
        LogError("Invalid arguments: iothubtransport_amqp_methods_handle=%p, session_handle=%p, on_methods_error=%p, on_method_request_received=%p, on_methods_unsubscribed=%p",
            iothubtransport_amqp_methods_handle, session_handle, on_methods_error, on_method_request_received, on_methods_unsubscribed);
        result = MU_FAILURE;
    }
    else if (iothubtransport_amqp_methods_handle->subscribe_state != SUBSCRIBE_STATE_NOT_SUBSCRIBED)
    {
        LogError("Already subscribed");
        result = MU_FAILURE;
    }
    else
    {
        STRING_HANDLE peer_endpoint_string = create_peer_endpoint_name(iothubtransport_amqp_methods_handle);
        if (peer_endpoint_string == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            iothubtransport_amqp_methods_handle->on_method_request_received = on_method_request_received;
            iothubtransport_amqp_methods_handle->on_method_request_received_context = on_method_request_received_context;
            iothubtransport_amqp_methods_handle->on_methods_error = on_methods_error;
            iothubtransport_amqp_methods_handle->on_methods_error_context = on_methods_error_context;
            iothubtransport_amqp_methods_handle->on_methods_unsubscribed = on_methods_unsubscribed;
            iothubtransport_amqp_methods_handle->on_methods_unsubscribed_context = on_methods_unsubscribed_context;

            AMQP_VALUE receiver_source = messaging_create_source(STRING_c_str(peer_endpoint_string));
            if (receiver_source == NULL)
            {
                LogError("Cannot create receiver source");
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE receiver_target = messaging_create_target("requests");
                if (receiver_target == NULL)
                {
                    LogError("Cannot create receiver target");
                    result = MU_FAILURE;
                }
                else
                {
                    STRING_HANDLE requests_link_name = create_requests_link_name(iothubtransport_amqp_methods_handle);
                    if (requests_link_name == NULL)
                    {
                        LogError("Cannot create methods requests link name.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        iothubtransport_amqp_methods_handle->receiver_link = link_create(session_handle, STRING_c_str(requests_link_name), role_receiver, receiver_source, receiver_target);
                        if (iothubtransport_amqp_methods_handle->receiver_link == NULL)
                        {
                            LogError("Cannot create receiver link");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            AMQP_VALUE sender_source = messaging_create_source("responses");
                            if (sender_source == NULL)
                            {
                                LogError("Cannot create sender source");
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE sender_target = messaging_create_target(STRING_c_str(peer_endpoint_string));
                                if (sender_target == NULL)
                                {
                                    LogError("Cannot create sender target");
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    STRING_HANDLE responses_link_name = create_responses_link_name(iothubtransport_amqp_methods_handle);
                                    if (responses_link_name == NULL)
                                    {
                                        LogError("Cannot create methods responses link name.");
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        iothubtransport_amqp_methods_handle->sender_link = link_create(session_handle, STRING_c_str(responses_link_name), role_sender, sender_source, sender_target);
                                        if (iothubtransport_amqp_methods_handle->sender_link == NULL)
                                        {
                                            LogError("Cannot create sender link");
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            if (set_link_attach_properties(iothubtransport_amqp_methods_handle) != 0)
                                            {
                                                result = MU_FAILURE;
                                            }
                                            else
                                            {
                                                iothubtransport_amqp_methods_handle->message_receiver = messagereceiver_create(iothubtransport_amqp_methods_handle->receiver_link, on_message_receiver_state_changed, iothubtransport_amqp_methods_handle);
                                                if (iothubtransport_amqp_methods_handle->message_receiver == NULL)
                                                {
                                                    LogError("Cannot create message receiver");
                                                    result = MU_FAILURE;
                                                }
                                                else
                                                {
                                                    iothubtransport_amqp_methods_handle->message_sender = messagesender_create(iothubtransport_amqp_methods_handle->sender_link, on_message_sender_state_changed, iothubtransport_amqp_methods_handle);
                                                    if (iothubtransport_amqp_methods_handle->message_sender == NULL)
                                                    {
                                                        LogError("Cannot create message sender");
                                                        result = MU_FAILURE;
                                                    }
                                                    else
                                                    {
                                                        if (messagesender_open(iothubtransport_amqp_methods_handle->message_sender) != 0)
                                                        {
                                                            LogError("Cannot open the message sender");
                                                            result = MU_FAILURE;
                                                        }
                                                        else
                                                        {
                                                            if (messagereceiver_open(iothubtransport_amqp_methods_handle->message_receiver, on_message_received, iothubtransport_amqp_methods_handle) != 0)
                                                            {
                                                                LogError("Cannot open the message receiver");
                                                                result = MU_FAILURE;
                                                            }
                                                            else
                                                            {
                                                                iothubtransport_amqp_methods_handle->subscribe_state = SUBSCRIBE_STATE_SUBSCRIBED;

                                                                result = 0;
                                                            }
                                                        }
                                                    }
                                                }
                                            }
                                        }

                                        STRING_delete(responses_link_name);
                                    }

                                    amqpvalue_destroy(sender_target);
                                }

                                amqpvalue_destroy(sender_source);
                            }
                        }

                        STRING_delete(requests_link_name);
                    }

                    amqpvalue_destroy(receiver_target);
                }

                amqpvalue_destroy(receiver_source);
            }

            STRING_delete(peer_endpoint_string);
        }
    }

    return result;
}